

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O1

void __thiscall NaVector::min_max(NaVector *this,NaReal *vMin,NaReal *vMax)

{
  double dVar1;
  NaReal NVar2;
  NaReal *pNVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  iVar4 = (*this->_vptr_NaVector[6])();
  if (iVar4 != 0) {
    uVar6 = 0;
    do {
      if (uVar6 == 0) {
        NVar2 = *this->pVect;
        *vMax = NVar2;
        *vMin = NVar2;
      }
      else {
        pNVar3 = this->pVect;
        dVar1 = pNVar3[uVar6];
        if (dVar1 < *vMin) {
          *vMin = dVar1;
        }
        dVar1 = pNVar3[uVar6];
        if (*vMax <= dVar1 && dVar1 != *vMax) {
          *vMax = dVar1;
        }
      }
      uVar6 = uVar6 + 1;
      uVar5 = (*this->_vptr_NaVector[6])(this);
    } while (uVar6 < uVar5);
  }
  return;
}

Assistant:

void
NaVector::min_max (NaReal& vMin, NaReal& vMax) const
{
    unsigned    i;
    for(i = 0; i < dim(); ++i){
        if(0 == i)
            vMin = vMax = pVect[i];
        else{
            if(pVect[i] < vMin)
                vMin = pVect[i];
            if(pVect[i] > vMax)
                vMax = pVect[i];
        }
    }
}